

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# items.cpp
# Opt level: O3

void __thiscall CItems::RenderProjectile(CItems *this,CNetObj_Projectile *pCurrent,int ItemID)

{
  int iVar1;
  int iVar2;
  CNetObj_GameData *pCVar3;
  IGraphics *pIVar4;
  undefined1 auVar5 [12];
  bool bVar6;
  uint uVar7;
  CGameClient *pCVar8;
  CEffects *this_00;
  long in_FS_OFFSET;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 extraout_var [12];
  undefined1 auVar11 [16];
  float fVar12;
  undefined4 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_48;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_44;
  vec2 local_38;
  undefined8 uStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = pCurrent->m_Type - 1;
  auVar10 = ZEXT816(0);
  if (uVar7 < 3) {
    pCVar8 = (this->super_CComponent).m_pClient;
    auVar10._0_4_ =
         (float)*(int *)((long)(pCVar8->m_All).m_paComponents +
                        *(long *)(&DAT_001d9f98 + (ulong)uVar7 * 8) + -0x10);
    auVar10._4_4_ =
         (float)*(int *)((long)(pCVar8->m_All).m_paComponents +
                        *(long *)(&DAT_001d9fb0 + (ulong)uVar7 * 8) + -0x10);
    auVar10._8_8_ = 0;
    auVar10 = divps(auVar10,_DAT_001d9ee0);
  }
  if (RenderProjectile(CNetObj_Projectile_const*,int)::s_LastGameTickTime == '\0') {
    RenderProjectile(this);
  }
  pCVar8 = (this->super_CComponent).m_pClient;
  pCVar3 = (pCVar8->m_Snap).m_pGameData;
  if ((pCVar3 == (CNetObj_GameData *)0x0) || ((pCVar3->m_GameStateFlags & 0x1c) == 0)) {
    bVar6 = CGameClient::IsDemoPlaybackPaused(pCVar8);
    pCVar8 = (this->super_CComponent).m_pClient;
    if (!bVar6) {
      RenderProjectile::s_LastGameTickTime = pCVar8->m_pClient->m_GameTickTime;
    }
  }
  bVar6 = CGameClient::ShouldUsePredicted(pCVar8);
  pCVar8 = (this->super_CComponent).m_pClient;
  if ((bVar6) && (pCVar8->m_pConfig->m_ClPredictProjectiles != 0)) {
    fVar9 = ((float)(~pCurrent->m_StartTick + pCVar8->m_pClient->m_PredTick) +
            pCVar8->m_pClient->m_PredIntraTick) / 50.0;
  }
  else {
    fVar9 = (float)(pCVar8->m_pClient->m_PrevGameTick - pCurrent->m_StartTick) / 50.0 +
            RenderProjectile::s_LastGameTickTime;
  }
  if ((0.0 <= fVar9) ||
     (bVar6 = RenderProjectile::s_LastGameTickTime * -0.5 < fVar9, fVar9 = 0.0, bVar6)) {
    iVar1 = pCurrent->m_X;
    iVar2 = pCurrent->m_Y;
    fVar12 = (float)pCurrent->m_VelY / 100.0;
    uVar13 = auVar10._0_4_;
    fVar16 = auVar10._4_4_ * fVar9;
    auVar5._4_8_ = auVar10._8_8_;
    auVar5._0_4_ = uVar13;
    auVar15._0_8_ = auVar5._0_8_ << 0x20;
    auVar15._8_4_ = uVar13;
    auVar15._12_4_ = uVar13;
    auVar14._4_12_ = auVar15._4_12_;
    auVar14._0_4_ = (float)pCurrent->m_VelX;
    auVar15 = divps(auVar14,_DAT_001d9ef0);
    local_48.x = fVar16 * auVar15._0_4_ + (float)iVar1;
    aStack_44.y = fVar16 * fVar16 * auVar15._4_4_ + fVar12 * fVar16 + (float)iVar2;
    fVar9 = (fVar9 + -0.001) * auVar10._4_4_;
    (*(pCVar8->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
              (pCVar8->m_pGraphics,(ulong)(uint)g_pData->m_aImages[1].m_Id.m_Id);
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])
              ();
    uVar7 = 5;
    if (pCurrent->m_Type < 5) {
      uVar7 = pCurrent->m_Type;
    }
    if ((int)uVar7 < 1) {
      uVar7 = 0;
    }
    CRenderTools::SelectSprite
              (&((this->super_CComponent).m_pClient)->m_RenderTools,
               (g_pData->m_Weapons).m_aId[uVar7].m_pSpriteProj,0,0,0);
    fVar16 = local_48.x - (fVar9 * auVar15._0_4_ + (float)iVar1);
    fVar9 = aStack_44.y - (fVar9 * fVar9 * auVar15._4_4_ + fVar12 * fVar9 + (float)iVar2);
    this_00 = ((this->super_CComponent).m_pClient)->m_pEffects;
    if (pCurrent->m_Type == 3) {
      CEffects::SmokeTrail(this_00,_local_48,(vec2)(CONCAT44(fVar9,fVar16) ^ 0x8000000080000000));
      fVar9 = ((this->super_CComponent).m_pClient)->m_pClient->m_LocalTime;
      if (RenderProjectile(CNetObj_Projectile_const*,int)::s_LastLocalTime == '\0') {
        RenderProjectile((CItems *)this_00);
      }
      fVar12 = fVar9 - RenderProjectile::s_LastLocalTime;
      fVar16 = CGameClient::GetAnimationPlaybackSpeed((this->super_CComponent).m_pClient);
      RenderProjectile::s_Time = fVar16 * fVar12 + RenderProjectile::s_Time;
      fVar12 = RenderProjectile::s_Time * 3.1415927 + RenderProjectile::s_Time * 3.1415927;
      auVar11._0_4_ = fVar12 + fVar12 + (float)ItemID;
      auVar11._4_12_ = extraout_var;
      (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x19]
      )(auVar11._0_8_);
      RenderProjectile::s_LastLocalTime = fVar9;
    }
    else {
      CEffects::BulletTrail(this_00,_local_48);
      pIVar4 = ((this->super_CComponent).m_pClient)->m_pGraphics;
      if (1e-05 < SQRT(fVar16 * fVar16 + fVar9 * fVar9)) {
        atan2f(fVar9,fVar16);
      }
      (*(pIVar4->super_IInterface)._vptr_IInterface[0x19])(pIVar4);
    }
    local_38 = _local_48;
    uStack_30 = 0x4200000042000000;
    pIVar4 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    (*(pIVar4->super_IInterface)._vptr_IInterface[0x1c])(pIVar4,&local_38,1);
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])
              ();
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])
              ();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CItems::RenderProjectile(const CNetObj_Projectile *pCurrent, int ItemID)
{
	// get positions
	float Curvature = 0;
	float Speed = 0;
	if(pCurrent->m_Type == WEAPON_GRENADE)
	{
		Curvature = m_pClient->m_Tuning.m_GrenadeCurvature;
		Speed = m_pClient->m_Tuning.m_GrenadeSpeed;
	}
	else if(pCurrent->m_Type == WEAPON_SHOTGUN)
	{
		Curvature = m_pClient->m_Tuning.m_ShotgunCurvature;
		Speed = m_pClient->m_Tuning.m_ShotgunSpeed;
	}
	else if(pCurrent->m_Type == WEAPON_GUN)
	{
		Curvature = m_pClient->m_Tuning.m_GunCurvature;
		Speed = m_pClient->m_Tuning.m_GunSpeed;
	}

	static float s_LastGameTickTime = Client()->GameTickTime();
	if(!m_pClient->IsWorldPaused() && !m_pClient->IsDemoPlaybackPaused())
		s_LastGameTickTime = Client()->GameTickTime();

	float Ct;
	if(m_pClient->ShouldUsePredicted() && Config()->m_ClPredictProjectiles)
		Ct = ((float)(Client()->PredGameTick() - 1 - pCurrent->m_StartTick) + Client()->PredIntraGameTick())/(float)SERVER_TICK_SPEED;
	else
		Ct = (Client()->PrevGameTick()-pCurrent->m_StartTick)/(float)SERVER_TICK_SPEED + s_LastGameTickTime;
	if(Ct < 0)
	{
		if(Ct > -s_LastGameTickTime / 2)
		{
			// Fixup the timing which might be screwed during demo playback because
			// s_LastGameTickTime depends on the system timer, while the other part
			// Client()->PrevGameTick()-pCurrent->m_StartTick)/(float)SERVER_TICK_SPEED
			// is virtually constant (for projectiles fired on the current game tick):
			// (x - (x+2)) / 50 = -0.04
			//
			// We have a strict comparison for the passed time being more than the time between ticks
			// if(CurtickStart > m_Info.m_CurrentTime) in CDemoPlayer::Update()
			// so on the practice the typical value of s_LastGameTickTime varies from 0.02386 to 0.03999
			// which leads to Ct from -0.00001 to -0.01614.
			// Round up those to 0.0 to fix missing rendering of the projectile.
			Ct = 0;
		}
		else
		{
			return; // projectile haven't been shot yet
		}
	}

	vec2 StartPos(pCurrent->m_X, pCurrent->m_Y);
	vec2 StartVel(pCurrent->m_VelX/100.0f, pCurrent->m_VelY/100.0f);
	vec2 Pos = CalcPos(StartPos, StartVel, Curvature, Speed, Ct);
	vec2 PrevPos = CalcPos(StartPos, StartVel, Curvature, Speed, Ct-0.001f);

	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_GAME].m_Id);
	Graphics()->QuadsBegin();

	RenderTools()->SelectSprite(g_pData->m_Weapons.m_aId[clamp(pCurrent->m_Type, 0, NUM_WEAPONS-1)].m_pSpriteProj);
	const vec2 Vel = Pos-PrevPos;

	// add particle for this projectile
	if(pCurrent->m_Type == WEAPON_GRENADE)
	{
		m_pClient->m_pEffects->SmokeTrail(Pos, Vel*-1);
		const float Now = Client()->LocalTime();
		static float s_Time = 0.0f;
		static float s_LastLocalTime = Now;
		s_Time += (Now - s_LastLocalTime) * m_pClient->GetAnimationPlaybackSpeed();
		Graphics()->QuadsSetRotation(s_Time*pi*2*2 + ItemID);
		s_LastLocalTime = Now;
	}
	else
	{
		m_pClient->m_pEffects->BulletTrail(Pos);
		Graphics()->QuadsSetRotation(length(Vel) > 0.00001f ? angle(Vel) : 0);
	}

	IGraphics::CQuadItem QuadItem(Pos.x, Pos.y, 32, 32);
	Graphics()->QuadsDraw(&QuadItem, 1);
	Graphics()->QuadsSetRotation(0);
	Graphics()->QuadsEnd();
}